

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O3

void __thiscall
TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test::
~TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test
          (TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerWinByDiscard_ManganOrMore)
{
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(3, 70));
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(4, 40));
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(4, 70));
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(5, 0));

	CHECK_EQUAL(12000, t.nonDealerWinByDiscard(6, 0));
	CHECK_EQUAL(12000, t.nonDealerWinByDiscard(7, 0));

	CHECK_EQUAL(16000, t.nonDealerWinByDiscard(8, 0));
	CHECK_EQUAL(16000, t.nonDealerWinByDiscard(9, 0));
	CHECK_EQUAL(16000, t.nonDealerWinByDiscard(10, 0));

	CHECK_EQUAL(24000, t.nonDealerWinByDiscard(11, 0));
	CHECK_EQUAL(24000, t.nonDealerWinByDiscard(12, 0));

	CHECK_EQUAL(32000, t.nonDealerWinByDiscard(13, 0));
}